

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetKeyOwner(ImGuiKey key,ImGuiID owner_id,ImGuiInputFlags flags)

{
  ImGuiKeyOwnerData *pIVar1;
  bool bVar2;
  bool bVar3;
  
  pIVar1 = GetKeyOwnerData(key);
  pIVar1->OwnerNext = owner_id;
  pIVar1->OwnerCurr = owner_id;
  bVar2 = (bool)((byte)flags >> 7);
  pIVar1->LockUntilRelease = bVar2;
  bVar3 = true;
  if ((flags & 0x40U) == 0) {
    bVar3 = bVar2;
  }
  pIVar1->LockThisFrame = bVar3;
  return;
}

Assistant:

void ImGui::SetKeyOwner(ImGuiKey key, ImGuiID owner_id, ImGuiInputFlags flags)
{
    IM_ASSERT(IsNamedKeyOrModKey(key) && (owner_id != ImGuiKeyOwner_Any || (flags & (ImGuiInputFlags_LockThisFrame | ImGuiInputFlags_LockUntilRelease)))); // Can only use _Any with _LockXXX flags (to eat a key away without an ID to retrieve it)
    IM_ASSERT((flags & ~ImGuiInputFlags_SupportedBySetKeyOwner) == 0); // Passing flags not supported by this function!

    ImGuiKeyOwnerData* owner_data = GetKeyOwnerData(key);
    owner_data->OwnerCurr = owner_data->OwnerNext = owner_id;

    // We cannot lock by default as it would likely break lots of legacy code.
    // In the case of using LockUntilRelease while key is not down we still lock during the frame (no key_data->Down test)
    owner_data->LockUntilRelease = (flags & ImGuiInputFlags_LockUntilRelease) != 0;
    owner_data->LockThisFrame = (flags & ImGuiInputFlags_LockThisFrame) != 0 || (owner_data->LockUntilRelease);
}